

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O0

MatrixXd * __thiscall
CppCNN::build_labels_matrix(MatrixXd *__return_storage_ptr__,CppCNN *this,VectorXd *train_labels)

{
  size_t rows;
  ostream *this_00;
  Index IVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  ulong uVar4;
  int local_4c;
  Scalar SStack_48;
  int i;
  ConstantReturnType local_40;
  undefined1 local_21;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_20;
  VectorXd *train_labels_local;
  CppCNN *this_local;
  MatrixXd *labels_mat;
  
  local_20 = &train_labels->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  train_labels_local = (VectorXd *)this;
  this_local = (CppCNN *)__return_storage_ptr__;
  this_00 = std::operator<<((ostream *)&std::cout,"build_labels_matrix");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_21 = 0;
  rows = this->__output_size;
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows(local_20);
  SStack_48 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Constant
            (&local_40,rows,IVar1,&stack0xffffffffffffffb8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_40);
  for (local_4c = 0;
      IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows(local_20),
      local_4c < IVar1; local_4c = local_4c + 1) {
    pSVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeff
                       (local_20,(long)local_4c);
    uVar4 = (ulong)*pSVar2;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        __return_storage_ptr__,
                        uVar4 | (long)(*pSVar2 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f,
                        (long)local_4c);
    *pSVar3 = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

MatrixXd CppCNN::build_labels_matrix(const Eigen::VectorXd& train_labels) {
	cout << __FUNCTION__ << endl;

	MatrixXd labels_mat = MatrixXd::Constant(__output_size, train_labels.rows(), 0);
	for (int i = 0; i < train_labels.rows(); i++)
		labels_mat(static_cast<size_t>(train_labels.coeff(i)), i) = 1;

	return labels_mat;
}